

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

FILE * open_module(char *name,char *search_dir)

{
  int iVar1;
  DIR *__dirp;
  dirent *pdVar2;
  size_t sVar3;
  size_t sVar4;
  char *__s;
  FILE *pFVar5;
  char *__s1;
  
  __dirp = opendir(search_dir);
  if (__dirp == (DIR *)0x0) {
    open_module_cold_3();
    pFVar5 = (FILE *)0x0;
  }
  else {
    pdVar2 = readdir(__dirp);
    while (pdVar2 != (dirent *)0x0) {
      __s1 = pdVar2->d_name;
      sVar3 = strlen(name);
      iVar1 = strncmp(__s1,name,sVar3);
      if ((iVar1 == 0) && ((__s1[sVar3] == '@' || (__s1[sVar3] == '.')))) {
        sVar3 = strlen(__s1);
        iVar1 = strcmp(__s1 + (sVar3 - 5),".yang");
        if (iVar1 == 0) {
          sVar4 = strlen(search_dir);
          __s = (char *)malloc(sVar3 + sVar4 + 2);
          if (__s == (char *)0x0) {
            open_module_cold_2();
          }
          else {
            sprintf(__s,"%s/%s",search_dir,__s1);
            pFVar5 = fopen(__s,"r");
            free(__s);
            if (pFVar5 != (FILE *)0x0) goto LAB_0010383e;
            open_module_cold_1();
          }
          break;
        }
      }
      pdVar2 = readdir(__dirp);
    }
    pFVar5 = (FILE *)0x0;
LAB_0010383e:
    closedir(__dirp);
  }
  return (FILE *)pFVar5;
}

Assistant:

static FILE *
open_module(const char *name, const char *search_dir)
{
    DIR *dir;
    struct dirent *dirent;
    char *path;
    FILE *ret = NULL;

    dir = opendir(search_dir);
    if (!dir) {
        fprintf(stderr, "Opening the directory \"%s\" failed (%s).\n", search_dir, strerror(errno));
        return NULL;
    }

    while ((dirent = readdir(dir))) {
        if (!strncmp(dirent->d_name, name, strlen(name))
                && ((dirent->d_name[strlen(name)] == '.') || (dirent->d_name[strlen(name)] == '@'))
                && !strcmp(dirent->d_name + strlen(dirent->d_name) - 5, ".yang")) {
            path = malloc(strlen(search_dir) + 1 + strlen(dirent->d_name) + 1);
            if (!path) {
                fprintf(stderr, "Memory allocation error (%s).\n", strerror(errno));
                break;
            }
            sprintf(path, "%s/%s", search_dir, dirent->d_name);
            ret = fopen(path, "r");
            free(path);

            if (!ret) {
                fprintf(stderr, "Opening file \"%s\" failed (%s).\n", dirent->d_name, strerror(errno));
            }
            break;
        }
    }

    closedir(dir);
    return ret;
}